

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int big2_charRefNumber(ENCODING *UNUSED_enc,char *ptr)

{
  int iVar1;
  bool bVar2;
  int local_40;
  int local_34;
  int c_1;
  int c;
  int result;
  char *ptr_local;
  ENCODING *UNUSED_enc_local;
  
  c_1 = 0;
  _c = ptr + 4;
  if ((*_c == '\0') && (ptr[5] == 'x')) {
    _c = ptr + 6;
    while( true ) {
      bVar2 = false;
      if (*_c == '\0') {
        bVar2 = _c[1] == ';';
      }
      if (bVar2) break;
      if (*_c == '\0') {
        local_34 = (int)_c[1];
      }
      else {
        local_34 = -1;
      }
      if (local_34 - 0x30U < 10) {
        c_1 = local_34 - 0x30U | c_1 << 4;
      }
      else if (local_34 - 0x41U < 6) {
        c_1 = local_34 + -0x37 + c_1 * 0x10;
      }
      else if (local_34 - 0x61U < 6) {
        c_1 = local_34 + -0x57 + c_1 * 0x10;
      }
      if (0x10ffff < c_1) {
        return -1;
      }
      _c = _c + 2;
    }
  }
  else {
    while( true ) {
      bVar2 = false;
      if (*_c == '\0') {
        bVar2 = _c[1] == ';';
      }
      if (bVar2) break;
      if (*_c == '\0') {
        local_40 = (int)_c[1];
      }
      else {
        local_40 = -1;
      }
      c_1 = local_40 + -0x30 + c_1 * 10;
      if (0x10ffff < c_1) {
        return -1;
      }
      _c = _c + 2;
    }
  }
  iVar1 = checkCharRefNumber(c_1);
  return iVar1;
}

Assistant:

PREFIX(charRefNumber)(const ENCODING *UNUSED_P(enc), const char *ptr)
{
  int result = 0;
  /* skip &# */
  ptr += 2*MINBPC(enc);
  if (CHAR_MATCHES(enc, ptr, ASCII_x)) {
    for (ptr += MINBPC(enc);
         !CHAR_MATCHES(enc, ptr, ASCII_SEMI);
         ptr += MINBPC(enc)) {
      int c = BYTE_TO_ASCII(enc, ptr);
      switch (c) {
      case ASCII_0: case ASCII_1: case ASCII_2: case ASCII_3: case ASCII_4:
      case ASCII_5: case ASCII_6: case ASCII_7: case ASCII_8: case ASCII_9:
        result <<= 4;
        result |= (c - ASCII_0);
        break;
      case ASCII_A: case ASCII_B: case ASCII_C:
      case ASCII_D: case ASCII_E: case ASCII_F:
        result <<= 4;
        result += 10 + (c - ASCII_A);
        break;
      case ASCII_a: case ASCII_b: case ASCII_c:
      case ASCII_d: case ASCII_e: case ASCII_f:
        result <<= 4;
        result += 10 + (c - ASCII_a);
        break;
      }
      if (result >= 0x110000)
        return -1;
    }
  }
  else {
    for (; !CHAR_MATCHES(enc, ptr, ASCII_SEMI); ptr += MINBPC(enc)) {
      int c = BYTE_TO_ASCII(enc, ptr);
      result *= 10;
      result += (c - ASCII_0);
      if (result >= 0x110000)
        return -1;
    }
  }
  return checkCharRefNumber(result);
}